

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QList<QCss::Declaration> * __thiscall
QCss::StyleSelector::declarationsForNode(StyleSelector *this,NodePtr node,char *extraPseudo)

{
  bool bVar1;
  QLatin1StringView *rhs;
  qsizetype qVar2;
  const_reference negated;
  quint64 qVar3;
  long in_RCX;
  StyleSelector *in_RDX;
  QLatin1String *in_RDI;
  long in_FS_OFFSET;
  quint64 pseudoClass;
  Selector *selector;
  int i;
  QList<QCss::Declaration> *decls;
  QString pseudoElement;
  QList<QCss::StyleRule> rules;
  NodePtr in_stack_000000e8;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  QLatin1String *this_00;
  int iVar4;
  uint3 in_stack_ffffffffffffff8c;
  uint uVar5;
  QList<QCss::StyleRule> local_28;
  StyleSelector *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffff8c;
  ((DataPointer *)&in_RDI->m_size)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI->m_data = (char *)&DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  local_10 = in_RDX;
  QList<QCss::Declaration>::QList((QList<QCss::Declaration> *)0xa394d4);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  styleRulesForNode(local_10,in_stack_000000e8);
  iVar4 = 0;
  while( true ) {
    rhs = (QLatin1StringView *)(long)iVar4;
    qVar2 = QList<QCss::StyleRule>::size(&local_28);
    if (qVar2 <= (long)rhs) break;
    QList<QCss::StyleRule>::at
              ((QList<QCss::StyleRule> *)rhs,
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    negated = QList<QCss::Selector>::at
                        ((QList<QCss::Selector> *)rhs,
                         CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    Selector::pseudoElement((Selector *)in_RDI);
    in_stack_ffffffffffffff4f = false;
    if (in_RCX != 0) {
      QLatin1String::QLatin1String(this_00,(char *)in_RDI);
      in_stack_ffffffffffffff4f = ::operator==((QString *)in_RDI,rhs);
    }
    if ((bool)in_stack_ffffffffffffff4f == false) {
      bVar1 = QString::isEmpty((QString *)0xa39634);
      if ((bVar1) &&
         ((qVar3 = Selector::pseudoClass((Selector *)CONCAT44(uVar5,iVar4),(quint64 *)negated),
          qVar3 == 1 || (qVar3 == 0x100)))) {
        QList<QCss::StyleRule>::at
                  ((QList<QCss::StyleRule> *)rhs,
                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
        QList<QCss::Declaration>::operator+=
                  ((QList<QCss::Declaration> *)rhs,
                   (QList<QCss::Declaration> *)
                   CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      }
    }
    else {
      QList<QCss::StyleRule>::at
                ((QList<QCss::StyleRule> *)rhs,
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
      QList<QCss::Declaration>::operator+=
                ((QList<QCss::Declaration> *)rhs,
                 (QList<QCss::Declaration> *)
                 CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    }
    QString::~QString((QString *)0xa3969d);
    iVar4 = iVar4 + 1;
  }
  uVar5 = 0x1000000;
  QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0xa396d5);
  if ((uVar5 & 0x1000000) == 0) {
    QList<QCss::Declaration>::~QList((QList<QCss::Declaration> *)0xa396e6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QCss::Declaration> *)this_00;
}

Assistant:

QList<Declaration> StyleSelector::declarationsForNode(NodePtr node, const char *extraPseudo)
{
    QList<Declaration> decls;
    QList<StyleRule> rules = styleRulesForNode(node);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        const QString pseudoElement = selector.pseudoElement();

        if (extraPseudo && pseudoElement == QLatin1StringView(extraPseudo)) {
            decls += rules.at(i).declarations;
            continue;
        }

        if (!pseudoElement.isEmpty()) // skip rules with pseudo elements
            continue;
        quint64 pseudoClass = selector.pseudoClass();
        if (pseudoClass == PseudoClass_Enabled || pseudoClass == PseudoClass_Unspecified)
            decls += rules.at(i).declarations;
    }
    return decls;
}